

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

void __thiscall comparer_context::cmp<unsigned_char>(comparer_context *this,size_t num,string *name)

{
  ostream *poVar1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  string *local_28;
  size_t n;
  string *name_local;
  size_t num_local;
  comparer_context *this_local;
  
  n = (size_t)name;
  name_local = (string *)num;
  num_local = (size_t)this;
  for (local_28 = (string *)0x0; local_28 < name_local; local_28 = (string *)&local_28->field_0x1) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar1 = std::operator<<(local_1a0,(string *)n);
    poVar1 = std::operator<<(poVar1,"[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ulong)local_28);
    std::operator<<(poVar1,"]");
    std::__cxx11::stringstream::str();
    cmp<unsigned_char>(this,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  return;
}

Assistant:

void cmp(size_t num,const std::string& name) {
        for(size_t n = 0; n < num; ++n) {
            std::stringstream ss;
            cmp<T>((ss<<name<<"["<<n<<"]",ss.str()));
    //      std::cout << name << " " << std::hex << a << std::endl;
        }
    }